

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::ushl_ov(APInt *this,APInt *ShAmt,bool *Overflow)

{
  uint numBits;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  APInt *R;
  APInt AVar6;
  
  bVar3 = ult((APInt *)Overflow,(ulong)ShAmt->BitWidth);
  *(bool *)in_RCX = !bVar3;
  numBits = ShAmt->BitWidth;
  if (bVar3) {
    if (numBits < 0x41) {
      uVar1 = (ShAmt->U).VAL;
      if (uVar1 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar2 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        uVar4 = (uint)lVar2 ^ 0x3f;
      }
      uVar4 = (numBits - 0x40) + uVar4;
    }
    else {
      uVar4 = countLeadingZerosSlowCase(ShAmt);
    }
    bVar3 = ugt((APInt *)Overflow,(ulong)uVar4);
    *(bool *)in_RCX = bVar3;
    APInt(this,ShAmt);
    operator<<=(this,(APInt *)Overflow);
    uVar5 = extraout_RDX_00;
  }
  else {
    APInt(this,numBits,0,false);
    uVar5 = extraout_RDX;
  }
  AVar6._8_8_ = uVar5;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::ushl_ov(const APInt &ShAmt, bool &Overflow) const {
  Overflow = ShAmt.uge(getBitWidth());
  if (Overflow)
    return APInt(BitWidth, 0);

  Overflow = ShAmt.ugt(countLeadingZeros());

  return *this << ShAmt;
}